

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O3

int __thiscall
boost::runtime::
parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(boost::runtime::args_amount)0,_false>
::clone(parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(boost::runtime::args_amount)0,_false>
        *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(boost::runtime::args_amount)0,_false>
  *p;
  
  p = (parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(boost::runtime::args_amount)0,_false>
       *)operator_new(0x130);
  basic_param::basic_param((basic_param *)p,(basic_param *)__fn);
  (p->super_basic_param)._vptr_basic_param = (_func_int **)&PTR__parameter_001ca228;
  (p->m_arg_factory).m_optional_value._M_dataplus._M_p =
       (pointer)&(p->m_arg_factory).m_optional_value.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(p->m_arg_factory).m_optional_value,*(long *)(__fn + 0xf0),
             *(long *)(__fn + 0xf8) + *(long *)(__fn + 0xf0));
  (p->m_arg_factory).m_default_value._M_dataplus._M_p =
       (pointer)&(p->m_arg_factory).m_default_value.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(p->m_arg_factory).m_default_value,*(long *)(__fn + 0x110),
             *(long *)(__fn + 0x118) + *(long *)(__fn + 0x110));
  shared_ptr<boost::runtime::basic_param>::
  shared_ptr<boost::runtime::parameter<std::__cxx11::string,(boost::runtime::args_amount)0,false>>
            ((shared_ptr<boost::runtime::basic_param> *)this,p);
  return (int)this;
}

Assistant:

virtual basic_param_ptr clone() const
    {
        return basic_param_ptr( new parameter( *this ) );
    }